

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DecimalFormatSymbols::initialize
          (DecimalFormatSymbols *this,Locale *loc,UErrorCode *status,UBool useLastResortData,
          NumberingSystem *ns)

{
  bool bVar1;
  UBool UVar2;
  int32_t iVar3;
  int iVar4;
  NumberingSystem *p;
  char *localeID;
  UResourceBundle *pUVar5;
  char *pcVar6;
  char *actualID;
  CharString *pCVar7;
  UnicodeString *this_00;
  UResourceBundle *pUVar8;
  UChar *pUVar9;
  StringPiece s;
  StringPiece s_00;
  StringPiece s_01;
  undefined1 local_2b0 [8];
  CurrencySpacingSink currencySink;
  LocalUResourceBundlePointer currencyResource;
  UnicodeString groupingSep;
  UnicodeString decimalSep;
  int32_t currPatternLen;
  LocalUResourceBundlePointer currency;
  LocalUResourceBundlePointer currencyResource_1;
  char cc [4];
  UErrorCode localStatus;
  char *locName;
  UChar aUStack_1e0 [2];
  int32_t uccLen;
  UChar ucc [4];
  undefined1 local_1d0 [4];
  int32_t currisoLength;
  UnicodeString tempStr;
  UChar curriso [4];
  UErrorCode internalStatus;
  UChar32 cp;
  UnicodeString *stringDigit;
  int32_t i_1;
  UChar32 tempCodePointZero;
  undefined4 local_168;
  undefined1 local_160 [12];
  undefined1 local_150 [12];
  undefined1 local_140 [8];
  CharString path;
  DecFmtSymDataSink sink;
  LocaleBased locBased;
  LocalPointerBase<UResourceBundle> local_b8;
  LocalUResourceBundlePointer numberElementsRes;
  LocalUResourceBundlePointer resource;
  char *locStr;
  uint local_98;
  int32_t i;
  UChar32 digit;
  int32_t digitIndex;
  UnicodeString digitString;
  char *nsName;
  LocalPointerBase<icu_63::NumberingSystem> local_38;
  LocalPointer<icu_63::NumberingSystem> nsLocal;
  NumberingSystem *ns_local;
  UBool useLastResortData_local;
  UErrorCode *status_local;
  Locale *loc_local;
  DecimalFormatSymbols *this_local;
  
  nsLocal.super_LocalPointerBase<icu_63::NumberingSystem>.ptr =
       (LocalPointerBase<icu_63::NumberingSystem>)(LocalPointerBase<icu_63::NumberingSystem>)ns;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 != '\0') {
    return;
  }
  this->actualLocale[0] = '\0';
  this->validLocale[0] = '\0';
  initialize(this);
  LocalPointer<icu_63::NumberingSystem>::LocalPointer
            ((LocalPointer<icu_63::NumberingSystem> *)&local_38,(NumberingSystem *)0x0);
  if (nsLocal.super_LocalPointerBase<icu_63::NumberingSystem>.ptr == (NumberingSystem *)0x0) {
    p = NumberingSystem::createInstance(loc,status);
    LocalPointer<icu_63::NumberingSystem>::adoptInstead
              ((LocalPointer<icu_63::NumberingSystem> *)&local_38,p);
    nsLocal.super_LocalPointerBase<icu_63::NumberingSystem>.ptr =
         (LocalPointerBase<icu_63::NumberingSystem>)
         LocalPointerBase<icu_63::NumberingSystem>::getAlias(&local_38);
  }
  UVar2 = ::U_SUCCESS(*status);
  if (((UVar2 == '\0') ||
      (iVar3 = NumberingSystem::getRadix
                         ((NumberingSystem *)
                          nsLocal.super_LocalPointerBase<icu_63::NumberingSystem>.ptr), iVar3 != 10)
      ) || (UVar2 = NumberingSystem::isAlgorithmic
                              ((NumberingSystem *)
                               nsLocal.super_LocalPointerBase<icu_63::NumberingSystem>.ptr),
           UVar2 != '\0')) {
    digitString.fUnion._48_8_ = &gLatn;
  }
  else {
    digitString.fUnion._48_8_ =
         NumberingSystem::getName
                   ((NumberingSystem *)nsLocal.super_LocalPointerBase<icu_63::NumberingSystem>.ptr);
    (**(code **)(*(long *)nsLocal.super_LocalPointerBase<icu_63::NumberingSystem>.ptr + 0x18))
              (&digit);
    i = 0;
    local_98 = UnicodeString::char32At((UnicodeString *)&digit,0);
    UnicodeString::setTo((UnicodeString *)&this->field_0x108,local_98);
    for (locStr._4_4_ = 0x12; locStr._4_4_ < 0x1b; locStr._4_4_ = locStr._4_4_ + 1) {
      i = (i - (uint)(local_98 < 0x10000)) + 2;
      local_98 = UnicodeString::char32At((UnicodeString *)&digit,i);
      UnicodeString::setTo((UnicodeString *)(&this->field_0x8 + (long)locStr._4_4_ * 0x40),local_98)
      ;
    }
    UnicodeString::~UnicodeString((UnicodeString *)&digit);
  }
  localeID = Locale::getName(loc);
  pUVar5 = ures_open_63((char *)0x0,localeID,status);
  LocalUResourceBundlePointer::LocalUResourceBundlePointer(&numberElementsRes,pUVar5);
  pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                     (&numberElementsRes.super_LocalPointerBase<UResourceBundle>);
  pUVar5 = ures_getByKeyWithFallback_63(pUVar5,"NumberElements",(UResourceBundle *)0x0,status);
  LocalUResourceBundlePointer::LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_b8,pUVar5);
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 != '\0') {
    if (useLastResortData != '\0') {
      *status = U_USING_DEFAULT_WARNING;
      initialize(this);
    }
    goto LAB_002ae58b;
  }
  LocaleBased::LocaleBased
            ((LocaleBased *)(sink.seenSymbol + 0x18),this->validLocale,this->actualLocale);
  pUVar5 = LocalPointerBase<UResourceBundle>::getAlias(&local_b8);
  pcVar6 = ures_getLocaleByType_63(pUVar5,ULOC_VALID_LOCALE,status);
  pUVar5 = LocalPointerBase<UResourceBundle>::getAlias(&local_b8);
  actualID = ures_getLocaleByType_63(pUVar5,ULOC_ACTUAL_LOCALE,status);
  LocaleBased::setLocaleIDs((LocaleBased *)(sink.seenSymbol + 0x18),pcVar6,actualID);
  anon_unknown_5::DecFmtSymDataSink::DecFmtSymDataSink((DecFmtSymDataSink *)&path.len,this);
  iVar4 = strcmp((char *)digitString.fUnion._48_8_,"latn");
  if (iVar4 == 0) {
LAB_002addab:
    UVar2 = anon_unknown_5::DecFmtSymDataSink::seenAll((DecFmtSymDataSink *)&path.len);
    if (UVar2 == '\0') {
      pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                         (&numberElementsRes.super_LocalPointerBase<UResourceBundle>);
      ures_getAllItemsWithFallback_63
                (pUVar5,"NumberElements/latn/symbols",(ResourceSink *)&path.len,status);
      UVar2 = ::U_FAILURE(*status);
      if (UVar2 != '\0') goto LAB_002ae57f;
    }
    anon_unknown_5::DecFmtSymDataSink::resolveMissingMonetarySeparators
              ((DecFmtSymDataSink *)&path.len,(UnicodeString *)&this->field_0x8);
    stringDigit._4_4_ = -1;
    for (stringDigit._0_4_ = 0; (int)stringDigit < 10; stringDigit._0_4_ = (int)stringDigit + 1) {
      this_00 = getConstDigitSymbol(this,(int)stringDigit);
      iVar3 = UnicodeString::countChar32(this_00,0,0x7fffffff);
      if (iVar3 != 1) {
        stringDigit._4_4_ = -1;
        break;
      }
      curriso._4_4_ = UnicodeString::char32At(this_00,0);
      iVar4 = curriso._4_4_;
      if (((int)stringDigit != 0) &&
         (iVar4 = stringDigit._4_4_, curriso._4_4_ != stringDigit._4_4_ + (int)stringDigit)) {
        stringDigit._4_4_ = -1;
        break;
      }
      stringDigit._4_4_ = iVar4;
    }
    this->fCodePointZero = stringDigit._4_4_;
    curriso[0] = L'\0';
    curriso[1] = L'\0';
    UnicodeString::UnicodeString((UnicodeString *)local_1d0);
    ucc._4_4_ = ucurr_forLocale_63(localeID,tempStr.fUnion.fStackFields.fBuffer + 0x17,4,
                                   (UErrorCode *)curriso);
    UVar2 = ::U_SUCCESS(curriso._0_4_);
    if ((UVar2 != '\0') && (ucc._4_4_ == 3)) {
      uprv_getStaticCurrencyName_63
                (tempStr.fUnion.fStackFields.fBuffer + 0x17,localeID,(UnicodeString *)local_1d0,
                 (UErrorCode *)curriso);
      UVar2 = ::U_SUCCESS(curriso._0_4_);
      if (UVar2 != '\0') {
        UnicodeString::setTo
                  ((UnicodeString *)&this->field_0x248,tempStr.fUnion.fStackFields.fBuffer + 0x17,
                   ucc._4_4_);
        UnicodeString::operator=((UnicodeString *)&this->field_0x208,(UnicodeString *)local_1d0);
      }
    }
    _aUStack_1e0 = 0;
    pcVar6 = Locale::getName(loc);
    currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr._4_4_ = U_ZERO_ERROR;
    iVar3 = ucurr_forLocale_63(pcVar6,aUStack_1e0,4,
                               (UErrorCode *)
                               ((long)&currencyResource_1.super_LocalPointerBase<UResourceBundle>.
                                       ptr + 4));
    UVar2 = ::U_SUCCESS(currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr._4_4_);
    if ((UVar2 != '\0') && (0 < iVar3)) {
      currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr._0_4_ = 0;
      u_UCharsToChars_63(aUStack_1e0,(char *)&currencyResource_1,iVar3);
      pUVar5 = ures_open_63("icudt63l-curr",localeID,
                            (UErrorCode *)
                            ((long)&currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr +
                            4));
      LocalUResourceBundlePointer::LocalUResourceBundlePointer(&currency,pUVar5);
      pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                         (&currency.super_LocalPointerBase<UResourceBundle>);
      pUVar5 = ures_getByKeyWithFallback_63
                         (pUVar5,"Currencies",(UResourceBundle *)0x0,
                          (UErrorCode *)
                          ((long)&currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr + 4
                          ));
      LocalUResourceBundlePointer::LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&stack0xfffffffffffffdf8,pUVar5);
      pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                         ((LocalPointerBase<UResourceBundle> *)&stack0xfffffffffffffdf8);
      pUVar8 = LocalPointerBase<UResourceBundle>::getAlias
                         ((LocalPointerBase<UResourceBundle> *)&stack0xfffffffffffffdf8);
      ures_getByKeyWithFallback_63
                (pUVar5,(char *)&currencyResource_1,pUVar8,
                 (UErrorCode *)
                 ((long)&currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr + 4));
      UVar2 = ::U_SUCCESS(currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr._4_4_);
      if (UVar2 != '\0') {
        pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                           ((LocalPointerBase<UResourceBundle> *)&stack0xfffffffffffffdf8);
        iVar3 = ures_getSize_63(pUVar5);
        if (2 < iVar3) {
          pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                             ((LocalPointerBase<UResourceBundle> *)&stack0xfffffffffffffdf8);
          pUVar8 = LocalPointerBase<UResourceBundle>::getAlias
                             ((LocalPointerBase<UResourceBundle> *)&stack0xfffffffffffffdf8);
          ures_getByIndex_63(pUVar5,2,pUVar8,
                             (UErrorCode *)
                             ((long)&currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr
                             + 4));
          decimalSep.fUnion._52_4_ = 0;
          pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                             ((LocalPointerBase<UResourceBundle> *)&stack0xfffffffffffffdf8);
          pUVar9 = ures_getStringByIndex_63
                             (pUVar5,0,(int32_t *)(decimalSep.fUnion.fStackFields.fBuffer + 0x19),
                              (UErrorCode *)
                              ((long)&currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr
                              + 4));
          this->currPattern = pUVar9;
          pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                             ((LocalPointerBase<UResourceBundle> *)&stack0xfffffffffffffdf8);
          ures_getUnicodeStringByIndex
                    ((UnicodeString *)((long)&groupingSep.fUnion + 0x30),pUVar5,1,
                     (UErrorCode *)
                     ((long)&currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr + 4));
          pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                             ((LocalPointerBase<UResourceBundle> *)&stack0xfffffffffffffdf8);
          ures_getUnicodeStringByIndex
                    ((UnicodeString *)&currencyResource,pUVar5,2,
                     (UErrorCode *)
                     ((long)&currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr + 4));
          UVar2 = ::U_SUCCESS(currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr._4_4_);
          if (UVar2 != '\0') {
            UnicodeString::operator=
                      ((UnicodeString *)&this->field_0x448,(UnicodeString *)&currencyResource);
            UnicodeString::operator=
                      ((UnicodeString *)&this->field_0x288,
                       (UnicodeString *)((long)&groupingSep.fUnion + 0x30));
            *status = currencyResource_1.super_LocalPointerBase<UResourceBundle>.ptr._4_4_;
          }
          UnicodeString::~UnicodeString((UnicodeString *)&currencyResource);
          UnicodeString::~UnicodeString((UnicodeString *)((long)&groupingSep.fUnion + 0x30));
        }
      }
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                ((LocalUResourceBundlePointer *)&stack0xfffffffffffffdf8);
      LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&currency);
    }
    pUVar5 = ures_open_63("icudt63l-curr",localeID,status);
    LocalUResourceBundlePointer::LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&currencySink.hasBeforeCurrency,pUVar5);
    anon_unknown_5::CurrencySpacingSink::CurrencySpacingSink((CurrencySpacingSink *)local_2b0,this);
    pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                       ((LocalPointerBase<UResourceBundle> *)&currencySink.hasBeforeCurrency);
    ures_getAllItemsWithFallback_63(pUVar5,"currencySpacing",(ResourceSink *)local_2b0,status);
    anon_unknown_5::CurrencySpacingSink::resolveMissing((CurrencySpacingSink *)local_2b0);
    ::U_FAILURE(*status);
    anon_unknown_5::CurrencySpacingSink::~CurrencySpacingSink((CurrencySpacingSink *)local_2b0);
    LocalUResourceBundlePointer::~LocalUResourceBundlePointer
              ((LocalUResourceBundlePointer *)&currencySink.hasBeforeCurrency);
    UnicodeString::~UnicodeString((UnicodeString *)local_1d0);
  }
  else {
    CharString::CharString((CharString *)local_140);
    StringPiece::StringPiece((StringPiece *)local_150,"NumberElements");
    s._12_4_ = 0;
    s.ptr_ = (char *)local_150._0_8_;
    s.length_ = local_150._8_4_;
    pCVar7 = CharString::append((CharString *)local_140,s,status);
    pCVar7 = CharString::append(pCVar7,'/',status);
    StringPiece::StringPiece((StringPiece *)local_160,(char *)digitString.fUnion._48_8_);
    s_00._12_4_ = 0;
    s_00.ptr_ = (char *)local_160._0_8_;
    s_00.length_ = local_160._8_4_;
    pCVar7 = CharString::append(pCVar7,s_00,status);
    pCVar7 = CharString::append(pCVar7,'/',status);
    StringPiece::StringPiece((StringPiece *)&i_1,"symbols");
    s_01._12_4_ = 0;
    s_01.ptr_ = (char *)_i_1;
    s_01.length_ = local_168;
    CharString::append(pCVar7,s_01,status);
    pUVar5 = LocalPointerBase<UResourceBundle>::getAlias
                       (&numberElementsRes.super_LocalPointerBase<UResourceBundle>);
    pcVar6 = CharString::data((CharString *)local_140);
    ures_getAllItemsWithFallback_63(pUVar5,pcVar6,(ResourceSink *)&path.len,status);
    if (*status == U_MISSING_RESOURCE_ERROR) {
      *status = U_ZERO_ERROR;
LAB_002add83:
      bVar1 = false;
    }
    else {
      UVar2 = ::U_FAILURE(*status);
      if (UVar2 == '\0') goto LAB_002add83;
      bVar1 = true;
    }
    CharString::~CharString((CharString *)local_140);
    if (!bVar1) goto LAB_002addab;
  }
LAB_002ae57f:
  anon_unknown_5::DecFmtSymDataSink::~DecFmtSymDataSink((DecFmtSymDataSink *)&path.len);
LAB_002ae58b:
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer
            ((LocalUResourceBundlePointer *)&local_b8);
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&numberElementsRes);
  LocalPointer<icu_63::NumberingSystem>::~LocalPointer
            ((LocalPointer<icu_63::NumberingSystem> *)&local_38);
  return;
}

Assistant:

void
DecimalFormatSymbols::initialize(const Locale& loc, UErrorCode& status,
    UBool useLastResortData, const NumberingSystem* ns)
{
    if (U_FAILURE(status)) { return; }
    *validLocale = *actualLocale = 0;

    // First initialize all the symbols to the fallbacks for anything we can't find
    initialize();

    //
    // Next get the numbering system for this locale and set zero digit
    // and the digit string based on the numbering system for the locale
    //
    LocalPointer<NumberingSystem> nsLocal;
    if (ns == nullptr) {
        // Use the numbering system according to the locale.
        // Save it into a LocalPointer so it gets cleaned up.
        nsLocal.adoptInstead(NumberingSystem::createInstance(loc, status));
        ns = nsLocal.getAlias();
    }
    const char *nsName;
    if (U_SUCCESS(status) && ns->getRadix() == 10 && !ns->isAlgorithmic()) {
        nsName = ns->getName();
        UnicodeString digitString(ns->getDescription());
        int32_t digitIndex = 0;
        UChar32 digit = digitString.char32At(0);
        fSymbols[kZeroDigitSymbol].setTo(digit);
        for (int32_t i = kOneDigitSymbol; i <= kNineDigitSymbol; ++i) {
            digitIndex += U16_LENGTH(digit);
            digit = digitString.char32At(digitIndex);
            fSymbols[i].setTo(digit);
        }
    } else {
        nsName = gLatn;
    }

    // Open resource bundles
    const char* locStr = loc.getName();
    LocalUResourceBundlePointer resource(ures_open(NULL, locStr, &status));
    LocalUResourceBundlePointer numberElementsRes(
        ures_getByKeyWithFallback(resource.getAlias(), gNumberElements, NULL, &status));

    if (U_FAILURE(status)) {
        if ( useLastResortData ) {
            status = U_USING_DEFAULT_WARNING;
            initialize();
        }
        return;
    }

    // Set locale IDs
    // TODO: Is there a way to do this without depending on the resource bundle instance?
    U_LOCALE_BASED(locBased, *this);
    locBased.setLocaleIDs(
        ures_getLocaleByType(
            numberElementsRes.getAlias(),
            ULOC_VALID_LOCALE, &status),
        ures_getLocaleByType(
            numberElementsRes.getAlias(),
            ULOC_ACTUAL_LOCALE, &status));

    // Now load the rest of the data from the data sink.
    // Start with loading this nsName if it is not Latin.
    DecFmtSymDataSink sink(*this);
    if (uprv_strcmp(nsName, gLatn) != 0) {
        CharString path;
        path.append(gNumberElements, status)
            .append('/', status)
            .append(nsName, status)
            .append('/', status)
            .append(gSymbols, status);
        ures_getAllItemsWithFallback(resource.getAlias(), path.data(), sink, status);

        // If no symbols exist for the given nsName and resource bundle, silently ignore
        // and fall back to Latin.
        if (status == U_MISSING_RESOURCE_ERROR) {
            status = U_ZERO_ERROR;
        } else if (U_FAILURE(status)) {
            return;
        }
    }

    // Continue with Latin if necessary.
    if (!sink.seenAll()) {
        ures_getAllItemsWithFallback(resource.getAlias(), gNumberElementsLatnSymbols, sink, status);
        if (U_FAILURE(status)) { return; }
    }

    // Let the monetary number separators equal the default number separators if necessary.
    sink.resolveMissingMonetarySeparators(fSymbols);

    // Resolve codePointZero
    UChar32 tempCodePointZero = -1;
    for (int32_t i=0; i<=9; i++) {
        const UnicodeString& stringDigit = getConstDigitSymbol(i);
        if (stringDigit.countChar32() != 1) {
            tempCodePointZero = -1;
            break;
        }
        UChar32 cp = stringDigit.char32At(0);
        if (i == 0) {
            tempCodePointZero = cp;
        } else if (cp != tempCodePointZero + i) {
            tempCodePointZero = -1;
            break;
        }
    }
    fCodePointZero = tempCodePointZero;

    // Obtain currency data from the currency API.  This is strictly
    // for backward compatibility; we don't use DecimalFormatSymbols
    // for currency data anymore.
    UErrorCode internalStatus = U_ZERO_ERROR; // don't propagate failures out
    UChar curriso[4];
    UnicodeString tempStr;
    int32_t currisoLength = ucurr_forLocale(locStr, curriso, UPRV_LENGTHOF(curriso), &internalStatus);
    if (U_SUCCESS(internalStatus) && currisoLength == 3) {
        uprv_getStaticCurrencyName(curriso, locStr, tempStr, internalStatus);
        if (U_SUCCESS(internalStatus)) {
            fSymbols[kIntlCurrencySymbol].setTo(curriso, currisoLength);
            fSymbols[kCurrencySymbol] = tempStr;
        }
    }
    /* else use the default values. */

    //load the currency data
    UChar ucc[4]={0}; //Currency Codes are always 3 chars long
    int32_t uccLen = 4;
    const char* locName = loc.getName();
    UErrorCode localStatus = U_ZERO_ERROR;
    uccLen = ucurr_forLocale(locName, ucc, uccLen, &localStatus);

    // TODO: Currency pattern data loading is duplicated in number_formatimpl.cpp
    if(U_SUCCESS(localStatus) && uccLen > 0) {
        char cc[4]={0};
        u_UCharsToChars(ucc, cc, uccLen);
        /* An explicit currency was requested */
        LocalUResourceBundlePointer currencyResource(ures_open(U_ICUDATA_CURR, locStr, &localStatus));
        LocalUResourceBundlePointer currency(
            ures_getByKeyWithFallback(currencyResource.getAlias(), "Currencies", NULL, &localStatus));
        ures_getByKeyWithFallback(currency.getAlias(), cc, currency.getAlias(), &localStatus);
        if(U_SUCCESS(localStatus) && ures_getSize(currency.getAlias())>2) { // the length is 3 if more data is present
            ures_getByIndex(currency.getAlias(), 2, currency.getAlias(), &localStatus);
            int32_t currPatternLen = 0;
            currPattern =
                ures_getStringByIndex(currency.getAlias(), (int32_t)0, &currPatternLen, &localStatus);
            UnicodeString decimalSep =
                ures_getUnicodeStringByIndex(currency.getAlias(), (int32_t)1, &localStatus);
            UnicodeString groupingSep =
                ures_getUnicodeStringByIndex(currency.getAlias(), (int32_t)2, &localStatus);
            if(U_SUCCESS(localStatus)){
                fSymbols[kMonetaryGroupingSeparatorSymbol] = groupingSep;
                fSymbols[kMonetarySeparatorSymbol] = decimalSep;
                //pattern.setTo(TRUE, currPattern, currPatternLen);
                status = localStatus;
            }
        }
        /* else An explicit currency was requested and is unknown or locale data is malformed. */
        /* ucurr_* API will get the correct value later on. */
    }
        // else ignore the error if no currency

    // Currency Spacing.
    LocalUResourceBundlePointer currencyResource(ures_open(U_ICUDATA_CURR, locStr, &status));
    CurrencySpacingSink currencySink(*this);
    ures_getAllItemsWithFallback(currencyResource.getAlias(), gCurrencySpacingTag, currencySink, status);
    currencySink.resolveMissing();
    if (U_FAILURE(status)) { return; }
}